

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::DestroyProtos(RepeatedPtrFieldBase *this)

{
  _func_void_ptr_Arena_ptr *in_RSI;
  RepeatedPtrFieldBase *this_00;
  
  this_00 = (RepeatedPtrFieldBase *)&stack0xffffffffffffffe8;
  if (this->tagged_rep_or_elem_ != (void *)0x0) {
    if (this->arena_ == (Arena *)0x0) {
      DestroyProtos();
    }
    this->tagged_rep_or_elem_ = (void *)0x0;
    return;
  }
  DestroyProtos((RepeatedPtrFieldBase *)&stack0xffffffffffffffe8);
  AddInternal<void*(*)(google::protobuf::Arena*)>(this_00,in_RSI);
  return;
}

Assistant:

void RepeatedPtrFieldBase::DestroyProtos() {
  PROTOBUF_ALWAYS_INLINE_CALL Destroy<GenericTypeHandler<MessageLite>>();

  // TODO:  Eliminate this store when invoked from the destructor,
  // since it is dead.
  tagged_rep_or_elem_ = nullptr;
}